

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void closegoto(LexState *ls,int g,Labeldesc *label)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  Dyndata *pDVar4;
  undefined8 uVar5;
  long lVar6;
  LocVar *pLVar7;
  char *msg;
  long lVar8;
  Labeldesc *pLVar9;
  long lVar10;
  
  pDVar4 = ls->dyd;
  pLVar9 = (pDVar4->gt).arr;
  lVar10 = (long)g;
  lVar8 = lVar10 * 0x18;
  bVar3 = pLVar9[lVar10].nactvar;
  pLVar9 = pLVar9 + lVar10;
  if (label->nactvar <= bVar3) {
    luaK_patchlist(ls->fs,pLVar9->pc,label->pc);
    for (; lVar6 = (long)(pDVar4->gt).n + -1, lVar10 < lVar6; lVar10 = lVar10 + 1) {
      pLVar9 = (pDVar4->gt).arr;
      *(undefined8 *)(&pLVar9->nactvar + lVar8) = *(undefined8 *)(&pLVar9[1].nactvar + lVar8);
      puVar2 = (undefined8 *)((long)&pLVar9[1].name + lVar8);
      uVar5 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pLVar9->name + lVar8);
      *puVar1 = *puVar2;
      puVar1[1] = uVar5;
      lVar8 = lVar8 + 0x18;
    }
    (pDVar4->gt).n = (int)lVar6;
    return;
  }
  pLVar7 = getlocvar(ls->fs,(uint)bVar3);
  msg = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",
                         pLVar9->name + 1,(ulong)(uint)pLVar9->line,pLVar7->varname + 1);
  semerror(ls,msg);
}

Assistant:

static void closegoto (LexState *ls, int g, Labeldesc *label) {
  int i;
  FuncState *fs = ls->fs;
  Labellist *gl = &ls->dyd->gt;
  Labeldesc *gt = &gl->arr[g];
  lua_assert(eqstr(gt->name, label->name));
  if (gt->nactvar < label->nactvar) {
    TString *vname = getlocvar(fs, gt->nactvar)->varname;
    const char *msg = luaO_pushfstring(ls->L,
      "<goto %s> at line %d jumps into the scope of local '%s'",
      getstr(gt->name), gt->line, getstr(vname));
    semerror(ls, msg);
  }
  luaK_patchlist(fs, gt->pc, label->pc);
  /* remove goto from pending list */
  for (i = g; i < gl->n - 1; i++)
    gl->arr[i] = gl->arr[i + 1];
  gl->n--;
}